

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

ExprPtr __thiscall pegmatite::operator*(pegmatite *this,ExprPtr *e)

{
  UnaryExpr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  __shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (UnaryExpr *)operator_new(0x18);
  std::__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,(__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)e);
  std::__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,&local_40);
  anon_unknown.dwarf_4ffb8::UnaryExpr::UnaryExpr(this_00,(ExprPtr *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this_00->super_Expr)._vptr_Expr = (_func_int **)&PTR__UnaryExpr_00165d80;
  std::__shared_ptr<pegmatite::Expr,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pegmatite::Expr,void>
            ((__shared_ptr<pegmatite::Expr,(__gnu_cxx::_Lock_policy)2> *)this,(Expr *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator *(const ExprPtr &e)
{
	return ExprPtr(new Loop0Expr(e));
}